

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 __thiscall crnd::symbol_codec::get_bits(symbol_codec *this,uint32 num_bits)

{
  uint uVar1;
  byte *pbVar2;
  uint local_18;
  uint32 result;
  bit_buf_type c;
  uint32 num_bits_local;
  symbol_codec *this_local;
  
  while (this->m_bit_count < (int)num_bits) {
    local_18 = 0;
    if (this->m_pDecode_buf_next != this->m_pDecode_buf_end) {
      pbVar2 = this->m_pDecode_buf_next;
      this->m_pDecode_buf_next = pbVar2 + 1;
      local_18 = (uint)*pbVar2;
    }
    this->m_bit_count = this->m_bit_count + 8;
    this->m_bit_buf = local_18 << (0x20U - (char)this->m_bit_count & 0x1f) | this->m_bit_buf;
  }
  uVar1 = this->m_bit_buf;
  this->m_bit_buf = this->m_bit_buf << ((byte)num_bits & 0x1f);
  this->m_bit_count = this->m_bit_count - num_bits;
  return uVar1 >> (0x20 - (byte)num_bits & 0x1f);
}

Assistant:

uint32 symbol_codec::get_bits(uint32 num_bits)
    {
        CRND_ASSERT(num_bits <= 32U);

        while (m_bit_count < (int)num_bits)
        {
            bit_buf_type c = 0;
            if (m_pDecode_buf_next != m_pDecode_buf_end)
                c = *m_pDecode_buf_next++;

            m_bit_count += 8;
            CRND_ASSERT(m_bit_count <= cBitBufSize);

            m_bit_buf |= (c << (cBitBufSize - m_bit_count));
        }

        uint32 result = static_cast<uint32>(m_bit_buf >> (cBitBufSize - num_bits));

        m_bit_buf <<= num_bits;
        m_bit_count -= num_bits;

        return result;
    }